

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

ProgramSources * __thiscall
deqp::gles31::Functional::anon_unknown_1::IsolinesRenderCase::makeSources
          (ProgramSources *__return_storage_ptr__,IsolinesRenderCase *this,
          TessPrimitiveType primitiveType,SpacingMode spacing,char *vtxOutPosAttrName)

{
  ProgramSources *pPVar1;
  char *code;
  undefined1 usePointMode;
  undefined1 auStack_228 [40];
  undefined1 local_200 [40];
  undefined1 local_1d8 [40];
  string tessellationEvaluationTemplate;
  string local_190;
  string local_170;
  string local_150;
  string fragmentShaderTemplate;
  string vertexShaderTemplate;
  ProgramSources local_f0;
  
  usePointMode = SUB81(vtxOutPosAttrName,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_200,vtxOutPosAttrName,
             (allocator<char> *)&tessellationEvaluationTemplate);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                 "${GLSL_VERSION_DECL}\n\nin highp vec2 in_v_position;\n\nout highp vec2 ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                 ";\n\nvoid main (void)\n{\n\t");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_228,
                 vtxOutPosAttrName);
  std::operator+(&vertexShaderTemplate,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0,
                 " = in_v_position;\n}\n");
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)auStack_228);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::string::~string((string *)local_200);
  code = (char *)0x0;
  (anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)auStack_228,(_anonymous_namespace_ *)0x2,spacing,SPACINGMODE_EQUAL,
             (bool)usePointMode);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0,
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_228);
  std::operator+(&tessellationEvaluationTemplate,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0,
                 "\nin highp vec2 in_te_position[];\n\nout mediump vec4 in_f_color;\n\nuniform mediump float u_tessLevelOuter0;\nuniform mediump float u_tessLevelOuter1;\n\nvoid main (void)\n{\n\thighp vec2 corner0 = in_te_position[0];\n\thighp vec2 corner1 = in_te_position[1];\n\thighp vec2 corner2 = in_te_position[2];\n\thighp vec2 corner3 = in_te_position[3];\n\thighp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner0\n\t               + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner1\n\t               + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*corner2\n\t               + (    gl_TessCoord.x)*(    gl_TessCoord.y)*corner3;\n\tpos.y += 0.15*sin(gl_TessCoord.x*10.0);\n\tgl_Position = vec4(pos, 0.0, 1.0);\n\thighp int phaseX = int(round(gl_TessCoord.x*u_tessLevelOuter1));\n\thighp int phaseY = int(round(gl_TessCoord.y*u_tessLevelOuter0));\n\thighp int phase = (phaseX + phaseY) % 3;\n\tin_f_color = phase == 0 ? vec4(1.0, 0.0, 0.0, 1.0)\n\t           : phase == 1 ? vec4(0.0, 1.0, 0.0, 1.0)\n\t           :              vec4(0.0, 0.0, 1.0, 1.0);\n}\n"
                );
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)auStack_228);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragmentShaderTemplate,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin mediump vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,(allocator<char> *)&local_f0);
  memset(&local_f0,0,0xac);
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f0._193_8_ = 0;
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_150,
             (_anonymous_namespace_ *)
             (this->super_BasicVariousTessLevelsPosAttrCase).super_TestCase.m_context,
             (Context *)vertexShaderTemplate._M_dataplus._M_p,code);
  glu::VertexSource::VertexSource((VertexSource *)auStack_228,&local_150);
  pPVar1 = glu::ProgramSources::operator<<(&local_f0,(ShaderSource *)auStack_228);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_170,
             (_anonymous_namespace_ *)
             (this->super_BasicVariousTessLevelsPosAttrCase).super_TestCase.m_context,
             (Context *)tessellationEvaluationTemplate._M_dataplus._M_p,code);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_1d8,&local_170);
  pPVar1 = glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_1d8);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_190,
             (_anonymous_namespace_ *)
             (this->super_BasicVariousTessLevelsPosAttrCase).super_TestCase.m_context,
             (Context *)fragmentShaderTemplate._M_dataplus._M_p,code);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_200,&local_190);
  pPVar1 = glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_200);
  glu::ProgramSources::ProgramSources(__return_storage_ptr__,pPVar1);
  std::__cxx11::string::~string((string *)(local_200 + 8));
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)(local_1d8 + 8));
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)(auStack_228 + 8));
  std::__cxx11::string::~string((string *)&local_150);
  glu::ProgramSources::~ProgramSources(&local_f0);
  std::__cxx11::string::~string((string *)&fragmentShaderTemplate);
  std::__cxx11::string::~string((string *)&tessellationEvaluationTemplate);
  std::__cxx11::string::~string((string *)&vertexShaderTemplate);
  return __return_storage_ptr__;
}

Assistant:

const glu::ProgramSources makeSources (TessPrimitiveType primitiveType, SpacingMode spacing, const char* vtxOutPosAttrName) const
	{
		DE_ASSERT(primitiveType == TESSPRIMITIVETYPE_ISOLINES);
		DE_UNREF(primitiveType);

		std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "in highp vec2 in_v_position;\n"
													 "\n"
													 "out highp vec2 " + string(vtxOutPosAttrName) + ";\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	" + vtxOutPosAttrName + " = in_v_position;\n"
													 "}\n");
		std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
													 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 + getTessellationEvaluationInLayoutString(TESSPRIMITIVETYPE_ISOLINES, spacing) +
													 "\n"
													 "in highp vec2 in_te_position[];\n"
													 "\n"
													 "out mediump vec4 in_f_color;\n"
													 "\n"
													 "uniform mediump float u_tessLevelOuter0;\n"
													 "uniform mediump float u_tessLevelOuter1;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	highp vec2 corner0 = in_te_position[0];\n"
													 "	highp vec2 corner1 = in_te_position[1];\n"
													 "	highp vec2 corner2 = in_te_position[2];\n"
													 "	highp vec2 corner3 = in_te_position[3];\n"
													 "	highp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner0\n"
													 "	               + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner1\n"
													 "	               + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*corner2\n"
													 "	               + (    gl_TessCoord.x)*(    gl_TessCoord.y)*corner3;\n"
													 "	pos.y += 0.15*sin(gl_TessCoord.x*10.0);\n"
													 "	gl_Position = vec4(pos, 0.0, 1.0);\n"
													 "	highp int phaseX = int(round(gl_TessCoord.x*u_tessLevelOuter1));\n"
													 "	highp int phaseY = int(round(gl_TessCoord.y*u_tessLevelOuter0));\n"
													 "	highp int phase = (phaseX + phaseY) % 3;\n"
													 "	in_f_color = phase == 0 ? vec4(1.0, 0.0, 0.0, 1.0)\n"
													 "	           : phase == 1 ? vec4(0.0, 1.0, 0.0, 1.0)\n"
													 "	           :              vec4(0.0, 0.0, 1.0, 1.0);\n"
													 "}\n");
		std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "in mediump vec4 in_f_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = in_f_color;\n"
													 "}\n");

		return glu::ProgramSources()
				<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
				<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
				<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()));
	}